

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O1

FT_Error T1_Face_Init(FT_Stream stream,FT_Face t1face,FT_Int face_index,FT_Int num_params,
                     FT_Parameter *params)

{
  int iVar1;
  char cVar2;
  char cVar3;
  undefined4 uVar4;
  FT_String *pFVar5;
  FT_Face_Internal pFVar6;
  int *piVar7;
  FT_GlyphSlot_conflict pFVar8;
  uint uVar9;
  _func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *stream_00;
  FT_Error FVar10;
  int iVar11;
  int iVar12;
  FT_Pointer pvVar13;
  FT_String *pFVar14;
  void *pvVar15;
  FT_Face pFVar16;
  FT_Stream buffer;
  char *pcVar17;
  long lVar18;
  FT_Fixed FVar19;
  FT_Pointer pvVar20;
  byte *pbVar21;
  short sVar22;
  FT_Byte *pFVar23;
  char *pcVar24;
  FT_Face size_00;
  short sVar25;
  uint uVar26;
  FT_Face extraout_RDX;
  FT_Face extraout_RDX_00;
  FT_Face extraout_RDX_01;
  FT_Face extraout_RDX_02;
  FT_Face extraout_RDX_03;
  FT_Face extraout_RDX_04;
  FT_Face extraout_RDX_05;
  FT_Face extraout_RDX_06;
  FT_Face extraout_RDX_07;
  FT_Face extraout_RDX_08;
  FT_Face extraout_RDX_09;
  FT_Face extraout_RDX_10;
  FT_Face extraout_RDX_11;
  FT_Face extraout_RDX_12;
  FT_Face extraout_RDX_13;
  FT_Face extraout_RDX_14;
  FT_Face extraout_RDX_15;
  FT_Face extraout_RDX_16;
  FT_Face extraout_RDX_17;
  FT_Face extraout_RDX_18;
  FT_Face extraout_RDX_19;
  FT_Face extraout_RDX_20;
  FT_Face extraout_RDX_21;
  FT_Face extraout_RDX_22;
  FT_Face extraout_RDX_23;
  FT_Byte *extraout_RDX_24;
  FT_Byte *extraout_RDX_25;
  long lVar27;
  FT_Face extraout_RDX_26;
  FT_Face extraout_RDX_27;
  FT_Face extraout_RDX_28;
  FT_Face pFVar28;
  FT_Face extraout_RDX_29;
  FT_Face extraout_RDX_30;
  FT_Face extraout_RDX_31;
  byte bVar29;
  FT_Int FVar30;
  FT_UShort *pFVar31;
  FT_Long size_01;
  FT_Byte *pFVar32;
  undefined8 uVar33;
  undefined7 uVar39;
  undefined8 uVar34;
  FT_Stream pFVar35;
  T1_Loader pTVar36;
  T1_Loader __s2;
  undefined1 *puVar37;
  FT_ULong FVar38;
  FT_CMap_Class clazz;
  FT_UInt glyph_index;
  _func_FT_Long_PS_Parser *a;
  ulong uVar40;
  size_t __n;
  long lVar41;
  undefined8 *puVar42;
  FT_Face pFVar43;
  undefined1 local_c48 [8];
  T1_LoaderRec loader;
  ulong local_78;
  FT_Face local_70;
  FT_Face local_60;
  FT_ULong size;
  FT_Face local_50;
  FT_Error local_44;
  FT_UShort local_40;
  undefined2 uStack_3e;
  undefined4 uStack_3c;
  FT_Error error;
  FT_Error local_34 [2];
  FT_UShort tag;
  
  t1face->num_faces = 1;
  pvVar13 = ft_module_get_service(&t1face->driver->root,"postscript-cmaps",'\x01');
  t1face[3].num_glyphs = (FT_Long)pvVar13;
  pFVar14 = (FT_String *)FT_Get_Module_Interface((t1face->driver->root).library,"psaux");
  t1face[3].family_name = pFVar14;
  if (pFVar14 == (FT_String *)0x0) {
    return 0xb;
  }
  pvVar15 = FT_Get_Module_Interface((t1face->driver->root).library,"pshinter");
  *(void **)&t1face[3].units_per_EM = pvVar15;
  pFVar5 = t1face[3].family_name;
  memset(local_c48,0,0x2c8);
  t1face[3].bbox.yMin = -1;
  *(undefined4 *)&t1face[3].bbox.xMax = 0;
  t1face[1].memory = (FT_Memory)0x100000007;
  *(undefined4 *)((long)&t1face[1].available_sizes + 4) = 4;
  t1face[2].face_index = 0xf5c;
  t1face[1].driver = (FT_Driver)&DWORD_0027a000;
  pFVar16 = (FT_Face)t1face->memory;
  pFVar35 = t1face->stream;
  size_00 = pFVar16;
  (*(code *)**(undefined8 **)(pFVar5 + 8))(local_c48,0,0);
  loader.parser.stream = (FT_Stream)0x0;
  loader.parser.base_dict = (FT_Byte *)0x0;
  loader.parser.base_len = 0;
  loader.parser.private_dict._0_7_ = 0;
  loader.parser.private_dict._7_1_ = 0;
  loader.parser.private_len._0_1_ = '\0';
  loader.parser.private_len._1_1_ = '\0';
  loader.parser.private_len._2_1_ = 0;
  FVar30 = 0x26b4c5;
  loader.parser.root.funcs.load_field_table =
       (_func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *)pFVar35;
  FVar10 = check_type1_format(pFVar35,"%!PS-AdobeFont",0xe);
  local_40 = (FT_UShort)FVar10;
  uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
  if (FVar10 == 0) {
LAB_00231e7c:
    FVar30 = 0;
    FVar10 = FT_Stream_Seek(pFVar35,0);
    local_40 = (FT_UShort)FVar10;
    uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
    pFVar28 = extraout_RDX_01;
    if (FVar10 == 0) {
      pFVar31 = (FT_UShort *)local_34;
      FVar10 = read_pfb_tag(pFVar35,pFVar31,(FT_ULong *)&local_60);
      FVar30 = (FT_Int)pFVar31;
      local_40 = (FT_UShort)FVar10;
      uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
      pFVar28 = extraout_RDX_02;
      if (FVar10 == 0) {
        if ((FT_UShort)local_34[0] == 0x8001) {
          loader.parser.private_len._0_1_ = '\x01';
        }
        else {
          FVar30 = 0;
          FVar10 = FT_Stream_Seek(pFVar35,0);
          local_40 = (FT_UShort)FVar10;
          uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
          pFVar28 = extraout_RDX_09;
          if (FVar10 != 0) goto LAB_00231ea8;
          local_60 = (FT_Face)pFVar35->size;
        }
        pFVar43 = local_60;
        if (pFVar35->read == (FT_Stream_IoFunc)0x0) {
          loader.parser.stream = (FT_Stream)(pFVar35->base + pFVar35->pos);
          loader.parser.base_dict = (FT_Byte *)local_60;
          loader.parser.private_len._1_1_ = '\x01';
          pFVar28 = local_60;
          FVar10 = FT_Stream_Skip(pFVar35,(FT_Long)local_60);
          FVar30 = (FT_Int)pFVar28;
          local_40 = (FT_UShort)FVar10;
          uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
          pFVar28 = extraout_RDX_15;
          if (FVar10 == 0) {
LAB_00232213:
            local_c48 = (undefined1  [8])loader.parser.stream;
            loader.parser.root.base = loader.parser.base_dict + (long)&(loader.parser.stream)->base;
            loader.parser.root.cursor = (FT_Byte *)local_c48;
          }
        }
        else {
          pFVar28 = local_60;
          buffer = (FT_Stream)
                   ft_mem_alloc((FT_Memory)pFVar16,(FT_Long)local_60,(FT_Error *)&local_40);
          FVar30 = (FT_Int)pFVar28;
          pFVar28 = extraout_RDX_10;
          loader.parser.stream = buffer;
          if (CONCAT22(uStack_3e,local_40) == 0) {
            FVar10 = FT_Stream_Read(pFVar35,(FT_Byte *)buffer,(FT_ULong)pFVar43);
            FVar30 = (FT_Int)buffer;
            local_40 = (FT_UShort)FVar10;
            uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
            pFVar28 = extraout_RDX_11;
            if (FVar10 == 0) {
              loader.parser.base_dict = (FT_Byte *)pFVar43;
              goto LAB_00232213;
            }
          }
        }
      }
    }
  }
  else {
    pFVar28 = extraout_RDX;
    if ((char)FVar10 == '\x02') {
      FVar30 = 0x26b4d4;
      FVar10 = check_type1_format(pFVar35,"%!FontType",10);
      local_40 = (FT_UShort)FVar10;
      uStack_3e = (undefined2)((uint)FVar10 >> 0x10);
      pFVar28 = extraout_RDX_00;
      if (FVar10 == 0) goto LAB_00231e7c;
    }
  }
LAB_00231ea8:
  if ((CONCAT22(uStack_3e,local_40) != 0) && (loader.parser.private_len._1_1_ == '\0')) {
    ft_mem_free((FT_Memory)pFVar16,loader.parser.stream);
    FVar30 = (FT_Int)loader.parser.stream;
    loader.parser.stream = (FT_Stream)0x0;
    pFVar28 = extraout_RDX_03;
  }
  local_44 = CONCAT22(uStack_3e,local_40);
  if (local_44 == 0) {
    pTVar36 = (T1_Loader)local_c48;
    size_00 = (FT_Face)loader.parser.base_dict;
    local_44 = parse_dict((T1_Face)t1face,pTVar36,(FT_Byte *)loader.parser.stream,
                          (FT_ULong)loader.parser.base_dict);
    stream_00 = loader.parser.root.funcs.load_field_table;
    uVar34 = loader.parser.root._24_8_;
    FVar30 = (FT_Int)pTVar36;
    pFVar28 = extraout_RDX_04;
    if (local_44 == 0) {
      local_34[0] = 0;
      if ((char)loader.parser.private_len == '\0') {
        pFVar16 = (FT_Face)(loader.parser.base_dict + (long)loader.parser.stream);
        pFVar43 = (FT_Face)loader.parser.stream;
        do {
          FVar30 = (FT_Int)pTVar36;
          pFVar43 = (FT_Face)((long)&pFVar43->face_index + 2);
          while (((((size_00 = (FT_Face)((long)&pFVar43[-1].internal + 7),
                    *(char *)((long)&pFVar43[-1].extensions + 6) != 'e' || (pFVar16 <= size_00)) ||
                   (*(char *)((long)&pFVar43[-1].extensions + 7) != 'e')) ||
                  ((*(char *)&pFVar43[-1].internal != 'x' ||
                   (*(char *)((long)&pFVar43[-1].internal + 1) != 'e')))) ||
                 (*(char *)((long)&pFVar43[-1].internal + 2) != 'c'))) {
            size_00 = (FT_Face)((long)&pFVar43[-1].extensions + 7);
            pFVar43 = (FT_Face)((long)&pFVar43->num_faces + 1);
            if (pFVar16 <= size_00) goto LAB_002322e3;
          }
          local_c48 = (undefined1  [8])loader.parser.stream;
          loader.parser.root.base = (FT_Byte *)pFVar43;
          while ((ulong)local_c48 < pFVar43) {
            if (((*(char *)(uchar **)local_c48 == 'e') &&
                (size_00 = (FT_Face)((long)(uchar **)local_c48 + 5), size_00 < pFVar43)) &&
               ((*(char *)((long)(uchar **)local_c48 + 1) == 'e' &&
                (((*(char *)((long)(uchar **)local_c48 + 2) == 'x' &&
                  (*(char *)((long)(uchar **)local_c48 + 3) == 'e')) &&
                 (*(char *)((long)(uchar **)local_c48 + 4) == 'c')))))) {
              loader.parser.root.base =
                   loader.parser.base_dict + (long)&(loader.parser.stream)->base;
              (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_c48);
              pFVar32 = loader.parser.root.base;
              __n = (long)loader.parser.root.base - (long)local_c48;
              size = (FT_ULong)local_c48;
              uVar33 = 10;
              local_50 = (FT_Face)memchr((void *)local_c48,10,__n);
              if (local_50 == (FT_Face)0x0) {
                pFVar16 = (FT_Face)&DAT_00000001;
                pFVar28 = extraout_RDX_16;
              }
              else {
                uVar33 = 0xd;
                pFVar16 = (FT_Face)memchr((void *)size,0xd,__n);
                pFVar16 = (FT_Face)CONCAT71((int7)((ulong)pFVar16 >> 8),pFVar16 < local_50);
                pFVar28 = extraout_RDX_17;
              }
              FVar30 = (FT_Int)uVar33;
              size_00 = (FT_Face)CONCAT71((int7)((ulong)size_00 >> 8),size < pFVar32);
              if (size >= pFVar32) goto LAB_002322e3;
              lVar41 = 0;
              goto LAB_002322ad;
            }
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_c48);
            pFVar28 = extraout_RDX_07;
            if ((int)loader.parser.root.limit != 0) break;
            (*loader.parser.root.funcs.done)((PS_Parser)local_c48);
            pFVar28 = extraout_RDX_08;
          }
          FVar30 = (FT_Int)pTVar36;
          pFVar16 = (FT_Face)(loader.parser.base_dict + (long)&(loader.parser.stream)->base);
        } while (pFVar43 < pFVar16);
        goto LAB_002322e3;
      }
      size = FT_Stream_Pos((FT_Stream)loader.parser.root.funcs.load_field_table);
      loader.parser.private_dict._0_7_ = 0;
      loader.parser.private_dict._7_1_ = 0;
      while( true ) {
        pFVar31 = &local_40;
        local_34[0] = read_pfb_tag((FT_Stream)stream_00,&local_40,(FT_ULong *)&local_60);
        FVar30 = (FT_Int)pFVar31;
        pFVar28 = extraout_RDX_05;
        iVar11 = local_34[0];
        if (local_34[0] != 0) break;
        if (local_40 != 0x8002) {
          if (CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_) == 0)
          goto LAB_00232329;
          FVar38 = size;
          local_34[0] = FT_Stream_Seek((FT_Stream)stream_00,size);
          FVar30 = (FT_Int)FVar38;
          pFVar28 = extraout_RDX_12;
          iVar11 = local_34[0];
          if (local_34[0] == 0) {
            size_01 = CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
            loader.parser.base_len = (FT_ULong)ft_mem_alloc((FT_Memory)uVar34,size_01,local_34);
            FVar30 = (FT_Int)size_01;
            pFVar28 = extraout_RDX_13;
            iVar11 = local_34[0];
            if (local_34[0] == 0) {
              loader.parser.private_dict._0_7_ = 0;
              loader.parser.private_dict._7_1_ = 0;
              FVar10 = read_pfb_tag((FT_Stream)stream_00,&local_40,(FT_ULong *)&local_60);
              if ((FVar10 != 0) || (local_40 != 0x8002)) goto LAB_002321d4;
              goto LAB_00232185;
            }
          }
          break;
        }
        puVar37 = (undefined1 *)
                  ((long)&local_60->num_faces +
                  CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_));
        loader.parser.private_dict._0_7_ = SUB87(puVar37,0);
        loader.parser.private_dict._7_1_ = (undefined1)((ulong)puVar37 >> 0x38);
        pFVar16 = local_60;
        iVar11 = FT_Stream_Skip((FT_Stream)stream_00,(FT_Long)local_60);
        FVar30 = (FT_Int)pFVar16;
        pFVar28 = extraout_RDX_06;
        local_34[0] = iVar11;
        if (iVar11 != 0) break;
      }
      goto LAB_00232381;
    }
  }
  goto LAB_002323b0;
LAB_002322ad:
  do {
    bVar29 = *(byte *)(size + lVar41);
    pFVar28 = (FT_Face)(ulong)bVar29;
    if ((bVar29 != 9) && (bVar29 != 0x20)) {
      uVar39 = (undefined7)((ulong)uVar33 >> 8);
      uVar33 = CONCAT71(uVar39,bVar29 == 0xd);
      if (bVar29 != 10) {
        bVar29 = bVar29 == 0xd & (byte)pFVar16;
        uVar33 = CONCAT71(uVar39,bVar29);
        FVar30 = (FT_Int)uVar33;
        if (bVar29 == 0) {
          if ((char)size_00 != '\0') {
            size_00 = (FT_Face)(loader.parser.base_dict + (long)loader.parser.stream +
                               (-lVar41 - size));
            local_60 = size_00;
            local_50 = size_00;
            if (loader.parser.private_len._1_1_ == '\0') {
              loader.parser.private_len._2_1_ = 1;
              loader.parser.base_len = (FT_ULong)loader.parser.stream;
              loader.parser.private_dict._0_7_ = SUB87(size_00,0);
              loader.parser.private_dict._7_1_ = (undefined1)((ulong)size_00 >> 0x38);
              loader.parser.stream = (FT_Stream)0x0;
              loader.parser.base_dict = (FT_Byte *)0x0;
            }
            else {
              puVar37 = (undefined1 *)((long)&size_00->num_faces + 1);
              pFVar16 = (FT_Face)ft_mem_alloc((FT_Memory)uVar34,(FT_Long)puVar37,local_34);
              FVar30 = (FT_Int)puVar37;
              iVar12 = 4;
              pFVar28 = extraout_RDX_29;
              loader.parser.base_len = (FT_ULong)pFVar16;
              if (local_34[0] != 0) goto LAB_002322f0;
              loader.parser.private_dict._0_7_ = SUB87(local_50,0);
              loader.parser.private_dict._7_1_ = (undefined1)((ulong)local_50 >> 0x38);
            }
            pFVar28 = (FT_Face)(size + lVar41);
            pbVar21 = (byte *)(size + lVar41 + 3);
            if ((((pbVar21 < pFVar32) &&
                 ((*(byte *)&pFVar28->num_faces - 0x30 < 10 ||
                  ((uVar26 = *(byte *)&pFVar28->num_faces - 0x41, size_00 = (FT_Face)(ulong)uVar26,
                   uVar26 < 0x26 && ((0x3f0000003fU >> ((ulong)size_00 & 0x3f) & 1) != 0)))))) &&
                ((bVar29 = *(byte *)(size + 1 + lVar41), bVar29 - 0x30 < 10 ||
                 ((uVar26 = bVar29 - 0x41, size_00 = (FT_Face)(ulong)uVar26, uVar26 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)size_00 & 0x3f) & 1) != 0)))))) &&
               ((bVar29 = *(byte *)(size + 2 + lVar41), bVar29 - 0x30 < 10 ||
                ((uVar26 = bVar29 - 0x41, size_00 = (FT_Face)(ulong)uVar26, uVar26 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)size_00 & 0x3f) & 1) != 0)))))) {
              bVar29 = *pbVar21;
              uVar26 = bVar29 - 0x30;
              size_00 = (FT_Face)(ulong)uVar26;
              if ((uVar26 < 10) ||
                 ((uVar26 = bVar29 - 0x41, uVar26 < 0x26 &&
                  (size_00 = (FT_Face)0x3f0000003f,
                  (0x3f0000003fU >> ((ulong)uVar26 & 0x3f) & 1) != 0)))) {
                iVar12 = 0;
                FVar38 = loader.parser.base_len;
                local_c48 = (undefined1  [8])pFVar28;
                (**(code **)(*(long *)(pFVar5 + 8) + 0x30))
                          (local_c48,loader.parser.base_len,
                           CONCAT17(loader.parser.private_dict._7_1_,
                                    loader.parser.private_dict._0_7_),&local_40);
                FVar30 = (FT_Int)FVar38;
                pFVar16 = (FT_Face)CONCAT44(uStack_3c,CONCAT22(uStack_3e,local_40));
                loader.parser.private_dict._0_7_ = SUB87(pFVar16,0);
                loader.parser.private_dict._7_1_ = (undefined1)((uint)uStack_3c >> 0x18);
                *(undefined1 *)((long)&pFVar16->num_faces + loader.parser.base_len) = 0;
                size_00 = (FT_Face)loader.parser.base_len;
                pFVar28 = extraout_RDX_30;
                goto LAB_002322f0;
              }
            }
            pFVar16 = (FT_Face)memmove((void *)loader.parser.base_len,pFVar28,(size_t)local_50);
            FVar30 = (FT_Int)pFVar28;
            iVar12 = 0;
            pFVar28 = extraout_RDX_31;
            goto LAB_002322f0;
          }
          break;
        }
      }
    }
    FVar30 = (FT_Int)uVar33;
    pFVar23 = (FT_Byte *)(size + lVar41 + 1);
    lVar41 = lVar41 + 1;
    size_00 = (FT_Face)CONCAT71((int7)((ulong)pFVar23 >> 8),pFVar23 < pFVar32);
  } while (pFVar23 != pFVar32);
LAB_002322e3:
  local_34[0] = 3;
  iVar12 = 0xe;
LAB_002322f0:
  iVar11 = local_34[0];
  if (((iVar12 != 0xe) && (iVar12 != 4)) && (iVar11 = (int)pFVar16, iVar12 == 0)) goto LAB_00232305;
  goto LAB_00232381;
  while( true ) {
    puVar37 = (undefined1 *)
              ((long)&pFVar16->num_faces +
              CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_));
    loader.parser.private_dict._0_7_ = SUB87(puVar37,0);
    loader.parser.private_dict._7_1_ = (undefined1)((ulong)puVar37 >> 0x38);
    FVar10 = read_pfb_tag((FT_Stream)stream_00,&local_40,(FT_ULong *)&local_60);
    if ((FVar10 != 0) || (local_40 != 0x8002)) break;
LAB_00232185:
    pFVar16 = local_60;
    local_34[0] = 0;
    pFVar32 = (FT_Byte *)
              (loader.parser.base_len +
              CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_));
    local_34[0] = FT_Stream_Read((FT_Stream)stream_00,pFVar32,(FT_ULong)local_60);
    FVar30 = (FT_Int)pFVar32;
    pFVar28 = extraout_RDX_14;
    iVar11 = local_34[0];
    if (local_34[0] != 0) goto LAB_00232381;
  }
LAB_002321d4:
  local_34[0] = 0;
LAB_00232305:
  uVar34 = CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
  (**(code **)(pFVar5 + 0x20))(loader.parser.base_len,uVar34,0xd971);
  FVar30 = (FT_Int)uVar34;
  pFVar28 = extraout_RDX_18;
  if (CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_) < 4) {
LAB_00232329:
    local_34[0] = 3;
    iVar11 = local_34[0];
  }
  else {
    size_00 = (FT_Face)CONCAT71((int7)((ulong)size_00 >> 8),0x20);
    *(undefined1 *)loader.parser.base_len = 0x20;
    *(undefined1 *)(loader.parser.base_len + 1) = 0x20;
    *(undefined1 *)(loader.parser.base_len + 2) = 0x20;
    *(undefined1 *)(loader.parser.base_len + 3) = 0x20;
    loader.parser.root.cursor = (FT_Byte *)loader.parser.base_len;
    local_c48 = (undefined1  [8])loader.parser.base_len;
    loader.parser.root.base =
         (FT_Byte *)
         (loader.parser.base_len +
         CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_));
    iVar11 = local_34[0];
  }
LAB_00232381:
  local_44 = iVar11;
  if (iVar11 == 0) {
    pTVar36 = (T1_Loader)local_c48;
    size_00 = (FT_Face)CONCAT17(loader.parser.private_dict._7_1_,loader.parser.private_dict._0_7_);
    local_44 = parse_dict((T1_Face)t1face,pTVar36,(FT_Byte *)loader.parser.base_len,
                          (FT_ULong)size_00);
    FVar30 = (FT_Int)pTVar36;
    pFVar28 = extraout_RDX_19;
    if (local_44 == 0) {
      *(byte *)&t1face[1].num_charmaps = (byte)t1face[1].num_charmaps & 0xfe;
      piVar7 = (int *)t1face[3].bbox.xMin;
      if (piVar7 != (int *)0x0) {
        if ((piVar7[0xbe] != 0) && (piVar7[0xbe] != piVar7[1])) {
          piVar7[0xbe] = 0;
        }
        if ((*piVar7 == 0) || (piVar7[1] == 0)) {
          T1_Done_Blend((T1_Face)t1face);
          pFVar28 = extraout_RDX_26;
        }
      }
      lVar41 = t1face[3].bbox.xMin;
      if ((lVar41 != 0) && ((ulong)*(uint *)(lVar41 + 4) != 0)) {
        pFVar28 = (FT_Face)0x0;
        do {
          if (*(char *)((long)pFVar28 + 0xa8 + lVar41) == '\0') {
            T1_Done_Blend((T1_Face)t1face);
            pFVar28 = extraout_RDX_27;
            break;
          }
          pFVar28 = (FT_Face)((long)pFVar28 + 0x18);
        } while ((FT_Face)((ulong)*(uint *)(lVar41 + 4) * 0x18) != pFVar28);
      }
      if (t1face[3].bbox.xMin == 0) {
        *(undefined4 *)&t1face[3].bbox.xMax = 0;
      }
      else {
        size_00 = (FT_Face)(ulong)(uint)t1face[3].bbox.xMax;
        if (size_00 != (FT_Face)0x0) {
          pTVar36 = (T1_Loader)0x8;
          pvVar20 = ft_mem_realloc(t1face->memory,8,0,(FT_Long)size_00,(void *)0x0,&local_44);
          FVar30 = (FT_Int)pTVar36;
          t1face[3].bbox.yMax = (FT_Pos)pvVar20;
          pFVar28 = extraout_RDX_28;
          if (local_44 != 0) {
            *(undefined4 *)&t1face[3].bbox.xMax = 0;
            goto LAB_002323b0;
          }
        }
      }
      FVar30 = (FT_Int)pTVar36;
      t1face[2].max_advance_width = loader.encoding_table.funcs.release._0_2_;
      t1face[2].max_advance_height = loader.encoding_table.funcs.release._2_2_;
      if (loader.subrs.capacity != 0) {
        *(undefined4 *)&t1face[2].bbox.yMin = loader.swap_table.funcs.release._0_4_;
        t1face[2].generic.data = (void *)loader._592_8_;
        t1face[2].bbox.xMax = loader.subrs._32_8_;
        t1face[2].bbox.yMax = (FT_Pos)loader.subrs.elements;
        *(_func_void_PS_Table **)&t1face[2].units_per_EM = loader.subrs.funcs.release;
        loader.subrs.capacity = 0;
        loader.subrs.funcs.release = (_func_void_PS_Table *)0x0;
      }
      if ((t1face->internal->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) &&
         (loader.charstrings.capacity == 0)) {
        local_44 = 3;
      }
      size_00 = (FT_Face)0x0;
      loader.charstrings.capacity = 0;
      t1face[2].generic.finalizer = (FT_Generic_Finalizer)loader.glyph_names.funcs.release;
      t1face[2].size = (FT_Size)loader.charstrings._32_8_;
      t1face[2].charmap = (FT_CharMap)loader.charstrings.elements;
      t1face[2].bbox.xMin = loader._296_8_;
      t1face[2].glyph = (FT_GlyphSlot_conflict)loader.glyph_names._32_8_;
      loader.num_glyphs = 0;
      loader._300_4_ = 0;
      local_78._0_4_ = 0;
      loader.glyph_names.max_elems = 0;
      loader.glyph_names.num_elems = 0;
      if (*(int *)&t1face[2].style_name == 1) {
        pFVar28 = (FT_Face)(long)(int)loader.encoding_table.init;
        local_70._0_4_ = 0;
        if (0 < (long)pFVar28) {
          pFVar16 = (FT_Face)0x0;
          local_70 = (FT_Face)0x0;
          local_78 = 0;
          local_50 = pFVar28;
          do {
            *(undefined2 *)(*(long *)&t1face[2].num_charmaps + (long)pFVar16 * 2) = 0;
            t1face[2].charmaps[(long)pFVar16] = (FT_CharMap)".notdef";
            pcVar17 = *(char **)(loader.encoding_table._32_8_ + (long)pFVar16 * 8);
            size_00 = (FT_Face)CONCAT71(loader.encoding_table._33_7_,
                                        pcVar17 == (char *)0x0 ||
                                        (int)(uint)loader.encoding_table.funcs.release < 1);
            if (pcVar17 != (char *)0x0 && (int)(uint)loader.encoding_table.funcs.release >= 1) {
              pFVar8 = t1face[2].glyph;
              uVar40 = 0;
              size = (FT_ULong)pFVar16;
              do {
                __s2 = (T1_Loader)(&pFVar8->library)[uVar40];
                pTVar36 = __s2;
                iVar12 = strcmp(pcVar17,(char *)__s2);
                pFVar16 = (FT_Face)size;
                if (iVar12 == 0) {
                  *(short *)(*(long *)&t1face[2].num_charmaps + size * 2) = (short)uVar40;
                  t1face[2].charmaps[size] = (FT_CharMap)__s2;
                  iVar12 = strcmp(".notdef",(char *)__s2);
                  pFVar28 = local_50;
                  pTVar36 = __s2;
                  if (iVar12 != 0) {
                    if ((int)pFVar16 < (int)local_78) {
                      local_78 = (ulong)pFVar16;
                    }
                    local_78 = local_78 & 0xffffffff;
                    size_00 = local_70;
                    if ((long)(int)local_70 <= (long)pFVar16) {
                      size_00 = (FT_Face)(ulong)((int)pFVar16 + 1);
                      local_70 = size_00;
                    }
                  }
                  break;
                }
                uVar40 = uVar40 + 1;
                pFVar28 = local_50;
              } while ((uint)loader.encoding_table.funcs.release != uVar40);
            }
            FVar30 = (FT_Int)pTVar36;
            pFVar16 = (FT_Face)((long)&pFVar16->num_faces + 1);
          } while (pFVar16 != pFVar28);
        }
        *(undefined4 *)&t1face[2].field_0x3c = (undefined4)local_78;
        *(undefined4 *)&t1face[2].available_sizes = local_70._0_4_;
        t1face[2].num_fixed_sizes = loader.parser._184_4_;
      }
    }
  }
LAB_002323b0:
  uVar34 = loader.parser.root._24_8_;
  if (loader.encoding_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.encoding_table.funcs.add)((PS_Table)&loader.num_chars,FVar30,pFVar28,(FT_UInt)size_00);
    pFVar28 = extraout_RDX_20;
  }
  if (loader.charstrings.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.charstrings.funcs.add)
              ((PS_Table)&loader.glyph_names.funcs.release,FVar30,pFVar28,(FT_UInt)size_00);
    pFVar28 = extraout_RDX_21;
  }
  if (loader.glyph_names.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.glyph_names.funcs.add)((PS_Table)&loader.num_glyphs,FVar30,pFVar28,(FT_UInt)size_00);
    pFVar28 = extraout_RDX_22;
  }
  if (loader.swap_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.swap_table.funcs.add)
              ((PS_Table)&loader.charstrings.funcs.release,FVar30,pFVar28,(FT_UInt)size_00);
    pFVar28 = extraout_RDX_23;
  }
  if (loader.subrs.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.subrs.funcs.add)((PS_Table)&loader.num_subrs,FVar30,pFVar28,(FT_UInt)size_00);
  }
  ft_hash_str_free((FT_Hash)loader.subrs.funcs.release,(FT_Memory)uVar34);
  ft_mem_free((FT_Memory)uVar34,loader.subrs.funcs.release);
  loader.subrs.funcs.release = (_func_void_PS_Table *)0x0;
  pFVar35 = (FT_Stream)loader.parser.base_len;
  ft_mem_free((FT_Memory)loader.parser.root._24_8_,(void *)loader.parser.base_len);
  loader.parser.base_len = 0;
  pFVar32 = extraout_RDX_24;
  if (loader.parser.private_len._1_1_ == '\0') {
    pFVar35 = loader.parser.stream;
    ft_mem_free((FT_Memory)loader.parser.root._24_8_,loader.parser.stream);
    loader.parser.stream = (FT_Stream)0x0;
    pFVar32 = extraout_RDX_25;
  }
  (*loader.parser.root.funcs.init)
            ((PS_Parser)local_c48,(FT_Byte *)pFVar35,pFVar32,(FT_Memory)size_00);
  if (face_index < 0 || local_44 != 0) {
    return local_44;
  }
  if ((short)face_index != 0) {
    return 6;
  }
  iVar12._0_2_ = t1face[2].max_advance_width;
  iVar12._2_2_ = t1face[2].max_advance_height;
  t1face->num_glyphs = (long)iVar12;
  t1face->face_index = 0;
  uVar40 = t1face->face_flags;
  t1face->face_flags = uVar40 | 0xa11;
  if (*(char *)&t1face[1].style_name != '\0') {
    t1face->face_flags = uVar40 | 0xa15;
  }
  lVar41 = t1face[3].bbox.xMin;
  if (lVar41 != 0) {
    pbVar21 = (byte *)((long)&t1face->face_flags + 1);
    *pbVar21 = *pbVar21 | 1;
  }
  pcVar17 = (char *)t1face[1].style_flags;
  t1face->family_name = pcVar17;
  t1face->style_name = (FT_String *)0x0;
  if (pcVar17 == (char *)0x0) {
    if (t1face[2].family_name != (FT_String *)0x0) {
      t1face->family_name = t1face[2].family_name;
    }
  }
  else {
    pcVar24 = (char *)t1face[1].face_flags;
    if (pcVar24 != (char *)0x0) {
      while (cVar2 = *pcVar24, cVar2 != '\0') {
        cVar3 = *pcVar17;
        if (cVar2 == cVar3) {
          pcVar17 = pcVar17 + 1;
LAB_0023254e:
          pcVar24 = pcVar24 + 1;
        }
        else {
          if ((cVar2 == '-') || (cVar2 == ' ')) goto LAB_0023254e;
          if ((cVar3 != ' ') && (cVar3 != '-')) {
            if (cVar3 == '\0') {
              t1face->style_name = pcVar24;
            }
            goto LAB_00232583;
          }
          pcVar17 = pcVar17 + 1;
        }
      }
      t1face->style_name = "Regular";
    }
  }
LAB_00232583:
  if (t1face->style_name == (FT_String *)0x0) {
    pcVar17 = "Regular";
    if ((char *)t1face[1].num_glyphs != (char *)0x0) {
      pcVar17 = (char *)t1face[1].num_glyphs;
    }
    t1face->style_name = pcVar17;
  }
  uVar40 = (ulong)(t1face[1].family_name != (FT_String *)0x0);
  t1face->style_flags = uVar40;
  pcVar17 = (char *)t1face[1].num_glyphs;
  if ((pcVar17 != (char *)0x0) &&
     ((iVar12 = strcmp(pcVar17,"Bold"), iVar12 == 0 ||
      (iVar12 = strcmp(pcVar17,"Black"), iVar12 == 0)))) {
    t1face->style_flags = uVar40 | 2;
  }
  t1face->num_fixed_sizes = 0;
  t1face->available_sizes = (FT_Bitmap_Size *)0x0;
  pFVar6 = t1face[2].internal;
  (t1face->bbox).xMin = (long)t1face[2].extensions >> 0x10;
  (t1face->bbox).yMin = (long)pFVar6 >> 0x10;
  lVar18 = t1face[3].num_faces + 0xffff;
  (t1face->bbox).xMax = lVar18 >> 0x10;
  lVar27 = t1face[3].face_index + 0xffff;
  (t1face->bbox).yMax = lVar27 >> 0x10;
  if (t1face->units_per_EM == 0) {
    t1face->units_per_EM = 1000;
  }
  sVar25 = (short)((ulong)lVar27 >> 0x10);
  t1face->ascender = sVar25;
  sVar22 = (short)((ulong)pFVar6 >> 0x10);
  t1face->descender = sVar22;
  uVar9 = (uint)t1face->units_per_EM * 0xc;
  uVar26 = (int)sVar25 - (int)sVar22;
  if ((int)uVar26 <= (int)(short)((ulong)uVar9 * 0x1999999a >> 0x20)) {
    uVar26 = uVar9 / 10;
  }
  t1face->height = (FT_Short)uVar26;
  t1face->max_advance_width = (FT_Short)((ulong)lVar18 >> 0x10);
  pFVar5 = t1face[3].family_name;
  a = (_func_FT_Long_PS_Parser *)0x0;
  iVar12 = (*(code *)**(undefined8 **)(pFVar5 + 0x18))
                     (local_c48,t1face,0,0,t1face[2].glyph,lVar41,0,0,T1_Parse_Glyph);
  if (iVar12 == 0) {
    loader.parser.root.funcs.to_token_array._6_1_ = 1;
    loader.parser.root.funcs.to_token_array._4_1_ = 0;
    glyph_index = 0;
    iVar11._0_2_ = t1face[2].max_advance_width;
    iVar11._2_2_ = t1face[2].max_advance_height;
    if (iVar11 < 1) {
      a = (_func_FT_Long_PS_Parser *)0x0;
    }
    else {
      a = (_func_FT_Long_PS_Parser *)0x0;
      do {
        T1_Parse_Glyph((T1_Decoder_conflict)local_c48,glyph_index);
        if ((long)a < (long)loader.parser.root.funcs.to_int) {
          a = loader.parser.root.funcs.to_int;
        }
        if (glyph_index == 0) {
          a = loader.parser.root.funcs.to_int;
        }
        glyph_index = glyph_index + 1;
        iVar1._0_2_ = t1face[2].max_advance_width;
        iVar1._2_2_ = t1face[2].max_advance_height;
      } while ((int)glyph_index < iVar1);
    }
    (**(code **)(*(long *)(pFVar5 + 0x18) + 8))(local_c48);
  }
  if (iVar12 == 0) {
    FVar19 = FT_RoundFix((FT_Fixed)a);
    t1face->max_advance_width = (FT_Short)((ulong)FVar19 >> 0x10);
  }
  t1face->max_advance_height = t1face->height;
  uVar4 = *(undefined4 *)((long)&t1face[1].style_name + 2);
  t1face->underline_position = (short)uVar4;
  t1face->underline_thickness = (short)((uint)uVar4 >> 0x10);
  if (pvVar13 == (FT_Pointer)0x0) {
    return 0;
  }
  puVar42 = *(undefined8 **)(pFVar14 + 0x40);
  loader.parser.root.cursor = (FT_Byte *)0x10003756e6963;
  local_c48 = (undefined1  [8])t1face;
  FVar10 = FT_CMap_New((FT_CMap_Class)puVar42[3],(FT_Pointer)0x0,(FT_CharMap)local_c48,
                       (FT_CMap_conflict *)0x0);
  if (FVar10 != 0 && (char)FVar10 != -0x5d) {
    return FVar10;
  }
  loader.parser.root.cursor._0_6_ = CONCAT24(7,loader.parser.root.cursor._0_4_);
  FVar10 = 0;
  switch(*(undefined4 *)&t1face[2].style_name) {
  case 1:
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x41444243);
    loader.parser.root.cursor = (FT_Byte *)CONCAT26(2,loader.parser.root.cursor._0_6_);
    puVar42 = puVar42 + 2;
    break;
  case 2:
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x41444f42);
    loader.parser.root.cursor = (FT_Byte *)((ulong)loader.parser.root.cursor & 0xffffffffffff);
    break;
  case 3:
    puVar42 = puVar42 + 3;
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x6c617431);
    loader.parser.root.cursor = (FT_Byte *)CONCAT26(3,loader.parser.root.cursor._0_6_);
    break;
  case 4:
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x41444245);
    loader.parser.root.cursor = (FT_Byte *)CONCAT26(1,loader.parser.root.cursor._0_6_);
    puVar42 = puVar42 + 1;
    break;
  default:
    clazz = (FT_CMap_Class)0x0;
    goto LAB_00232936;
  }
  clazz = (FT_CMap_Class)*puVar42;
LAB_00232936:
  if (clazz != (FT_CMap_Class)0x0) {
    FVar10 = FT_CMap_New(clazz,(FT_Pointer)0x0,(FT_CharMap)local_c48,(FT_CMap_conflict *)0x0);
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Face_Init( FT_Stream      stream,
                FT_Face        t1face,          /* T1_Face */
                FT_Int         face_index,
                FT_Int         num_params,
                FT_Parameter*  params )
  {
    T1_Face             face = (T1_Face)t1face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T1_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    face->pshinter = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                              "pshinter" );

    FT_TRACE2(( "Type 1 driver\n" ));

    /* open the tokenizer; this will also check the font format */
    error = T1_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T1_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      FT_Face  root = (FT_Face)&face->root;


      root->num_glyphs = type1->num_glyphs;
      root->face_index = 0;

      root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_GLYPH_NAMES |
                          FT_FACE_FLAG_HINTER;

      if ( info->is_fixed_pitch )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( face->blend )
        root->face_flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;

      /* The following code to extract the family and the style is very   */
      /* simplistic and might get some things wrong.  For a full-featured */
      /* algorithm you might have a look at the whitepaper given at       */
      /*                                                                  */
      /*   https://blogs.msdn.com/text/archive/2007/04/23/wpf-font-selection-model.aspx */

      /* get style name -- be careful, some broken fonts only */
      /* have a `/FontName' dictionary entry!                 */
      root->family_name = info->family_name;
      root->style_name  = NULL;

      if ( root->family_name )
      {
        char*  full   = info->full_name;
        char*  family = root->family_name;


        if ( full )
        {
          FT_Bool  the_same = TRUE;


          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                the_same = FALSE;

                if ( !*family )
                  root->style_name = full;
                break;
              }
            }
          }

          if ( the_same )
            root->style_name = (char *)"Regular";
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( type1->font_name )
          root->family_name = type1->font_name;
      }

      if ( !root->style_name )
      {
        if ( info->weight )
          root->style_name = info->weight;
        else
          /* assume `Regular' style because we don't know better */
          root->style_name = (char *)"Regular";
      }

      /* compute style flags */
      root->style_flags = 0;
      if ( info->italic_angle )
        root->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          root->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      root->num_fixed_sizes = 0;
      root->available_sizes = NULL;

      root->bbox.xMin =   type1->font_bbox.xMin            >> 16;
      root->bbox.yMin =   type1->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      root->bbox.xMax = ( type1->font_bbox.xMax + 0xFFFF ) >> 16;
      root->bbox.yMax = ( type1->font_bbox.yMax + 0xFFFF ) >> 16;

      /* Set units_per_EM if we didn't set it in t1_parse_font_matrix. */
      if ( !root->units_per_EM )
        root->units_per_EM = 1000;

      root->ascender  = (FT_Short)( root->bbox.yMax );
      root->descender = (FT_Short)( root->bbox.yMin );

      root->height = (FT_Short)( ( root->units_per_EM * 12 ) / 10 );
      if ( root->height < root->ascender - root->descender )
        root->height = (FT_Short)( root->ascender - root->descender );

      /* now compute the maximum advance width */
      root->max_advance_width =
        (FT_Short)( root->bbox.xMax );
      {
        FT_Pos  max_advance;


        error = T1_Compute_Max_Advance( face, &max_advance );

        /* in case of error, keep the standard width */
        if ( !error )
          root->max_advance_width = (FT_Short)FIXED_TO_INT( max_advance );
        else
          error = FT_Err_Ok;   /* clear error */
      }

      root->max_advance_height = root->height;

      root->underline_position  = (FT_Short)info->underline_position;
      root->underline_thickness = (FT_Short)info->underline_thickness;
    }

    {
      FT_Face  root = &face->root;


      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }

  Exit:
    return error;
  }